

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

ConvexH * ConvexDecomposition::test_btbq(void)

{
  undefined8 uVar1;
  ConvexH *this;
  float3 *pfVar2;
  Plane *pPVar3;
  HalfEdge *pHVar4;
  Array<ConvexDecomposition::ConvexH::HalfEdge> *this_00;
  undefined1 auVar5 [16];
  
  this = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this,4,8,2);
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this,0);
  pfVar2->x = 0.0;
  pfVar2->y = 0.0;
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this,1);
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  pfVar2->x = (float)(int)uVar1;
  pfVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this,2);
  auVar5._8_4_ = 0x3f800000;
  auVar5._0_8_ = 0x3f8000003f800000;
  auVar5._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar5);
  pfVar2->x = (float)(int)uVar1;
  pfVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this,3);
  pfVar2->x = 0.0;
  pfVar2->y = 1.0;
  pfVar2->z = 0.0;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](&this->facets,0);
  (pPVar3->normal).x = 0.0;
  (pPVar3->normal).y = 0.0;
  *(undefined8 *)&(pPVar3->normal).z = 0x3f800000;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](&this->facets,1);
  this_00 = &this->edges;
  (pPVar3->normal).x = 0.0;
  (pPVar3->normal).y = 0.0;
  *(undefined8 *)&(pPVar3->normal).z = 0xbf800000;
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,0);
  pHVar4->ea = 7;
  pHVar4->v = '\0';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,1);
  pHVar4->ea = 6;
  pHVar4->v = '\x01';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,2);
  pHVar4->ea = 5;
  pHVar4->v = '\x02';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,3);
  pHVar4->ea = 4;
  pHVar4->v = '\x03';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,4);
  pHVar4->ea = 3;
  pHVar4->v = '\0';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,5);
  pHVar4->ea = 2;
  pHVar4->v = '\x03';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,6);
  pHVar4->ea = 1;
  pHVar4->v = '\x02';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_00,7);
  pHVar4->ea = 0;
  pHVar4->v = '\x01';
  pHVar4->p = '\x01';
  AssertIntact(this);
  return this;
}

Assistant:

ConvexH *test_btbq() {
	ConvexH *convex = new ConvexH(4,8,2);
	convex->vertices[0] = REAL3(0,0,0);
	convex->vertices[1] = REAL3(1,0,0);
	convex->vertices[2] = REAL3(1,1,0);
	convex->vertices[3] = REAL3(0,1,0);
	convex->facets[0] = Plane(REAL3(0,0,1),0);
	convex->facets[1] = Plane(REAL3(0,0,-1),0);
	convex->edges[0]  = HalfEdge(7,0,0);
	convex->edges[1]  = HalfEdge(6,1,0);
	convex->edges[2]  = HalfEdge(5,2,0);
	convex->edges[3]  = HalfEdge(4,3,0);

	convex->edges[4]  = HalfEdge(3,0,1);
	convex->edges[5]  = HalfEdge(2,3,1);
	convex->edges[6]  = HalfEdge(1,2,1);
	convex->edges[7]  = HalfEdge(0,1,1);
	AssertIntact(*convex);
	return convex;
}